

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_open_input_file_descriptor(sexp ctx,sexp self,sexp_sint_t n,sexp fileno,sexp shutdownp)

{
  sexp *ppsVar1;
  sexp psVar2;
  sexp_sint_t n_00;
  sexp str;
  sexp res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_58;
  sexp_conflict local_50;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_50 = (sexp_conflict)0x43e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  local_58 = (sexp)0x43e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  if ((((ulong)fileno & 3) == 0) && (fileno->tag == 0x12)) {
    if (-1 < (fileno->value).fileno.fd) {
      local_48.var = &local_50;
      local_38.next = &local_48;
      local_48.next = (ctx->value).context.saves;
      (ctx->value).context.saves = local_38.next;
      (ctx->value).context.saves = &local_38;
      local_38.var = &local_58;
      local_58 = sexp_make_string_op(ctx,(sexp)0x0,2,(sexp)&DAT_00002001,(sexp)&DAT_0000043e);
      psVar2 = sexp_open_input_string_op(ctx,(sexp)0x0,n_00,local_58);
      if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x13)) {
        (psVar2->value).type.slots = fileno;
        (psVar2->value).port.offset = 0x1000;
        (psVar2->value).flonum_bits[0x2a] = '\x01';
        (psVar2->value).flonum_bits[0x2b] = shutdownp != (sexp)&DAT_0000003e;
        ppsVar1 = &(fileno->value).type.slots;
        *ppsVar1 = (sexp)((long)&(*ppsVar1)->tag + 1);
      }
      (ctx->value).context.saves = local_48.next;
      return psVar2;
    }
    psVar2 = sexp_file_exception(ctx,self,"invalid file descriptor",fileno);
    return psVar2;
  }
  psVar2 = sexp_type_exception(ctx,self,0x12,fileno);
  return psVar2;
}

Assistant:

sexp sexp_open_input_file_descriptor (sexp ctx, sexp self, sexp_sint_t n, sexp fileno, sexp shutdownp) {
  sexp_gc_var2(res, str);
  sexp_assert_type(ctx, sexp_filenop, SEXP_FILENO, fileno);
  if (sexp_fileno_fd(fileno) < 0)
    return sexp_file_exception(ctx, self, "invalid file descriptor", fileno);
  sexp_gc_preserve2(ctx, res, str);
  str = sexp_make_string(ctx, sexp_make_fixnum(SEXP_PORT_BUFFER_SIZE), SEXP_VOID);
  res = sexp_open_input_string(ctx, str);
  if (!sexp_exceptionp(res)) {
    sexp_port_fd(res) = fileno;
    sexp_port_offset(res) = SEXP_PORT_BUFFER_SIZE;
    sexp_port_binaryp(res) = 1;
    sexp_port_shutdownp(res) = sexp_truep(shutdownp);
    sexp_fileno_count(fileno)++;
  }
  sexp_gc_release2(ctx);
  return res;
}